

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringStl.h
# Opt level: O2

string * __thiscall
Corrade::Containers::Implementation::
StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::to(string *__return_storage_ptr__,
    StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    *this,StringView other)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,this,this + ((ulong)other._data & 0x3fffffffffffffff),
             other._sizePlusFlags);
  return __return_storage_ptr__;
}

Assistant:

CORRADE_STRING_STL_INLINE std::string StringViewConverter<const char, std::string>::to(StringView other) {
    return std::string{other.data(), other.size()};
}